

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

SymBoundType __thiscall
GlobOpt::DetermineSymBoundOffsetOrValueRelativeToLandingPad
          (GlobOpt *this,StackSym *sym,bool landingPadValueIsLowerBound,ValueInfo *valueInfo,
          IntBounds *bounds,GlobOptBlockData *landingPadGlobOptBlockData,int *boundOffsetOrValueRef)

{
  code *pcVar1;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ValueInfo *pVVar6;
  int local_84;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_80;
  ValueNumber local_74;
  ValueNumber local_70;
  int local_6c;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBStack_68;
  int constantBound;
  RelativeIntBoundSet *boundSet;
  ValueRelativeOffset *bound;
  Value *pVStack_50;
  int landingPadConstantValue;
  Value *landingPadValue;
  GlobOptBlockData *pGStack_40;
  int constantValue;
  GlobOptBlockData *landingPadGlobOptBlockData_local;
  IntBounds *bounds_local;
  ValueInfo *valueInfo_local;
  StackSym *pSStack_20;
  bool landingPadValueIsLowerBound_local;
  StackSym *sym_local;
  GlobOpt *this_local;
  
  pGStack_40 = landingPadGlobOptBlockData;
  landingPadGlobOptBlockData_local = (GlobOptBlockData *)bounds;
  bounds_local = (IntBounds *)valueInfo;
  valueInfo_local._7_1_ = landingPadValueIsLowerBound;
  pSStack_20 = sym;
  sym_local = (StackSym *)this;
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51b,"(sym)","sym");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = StackSym::IsTypeSpec(pSStack_20);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51c,"(!sym->IsTypeSpec())","!sym->IsTypeSpec()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (bounds_local == (IntBounds *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51d,"(valueInfo)","valueInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pGStack_40 == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51e,"(landingPadGlobOptBlockData)","landingPadGlobOptBlockData");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (boundOffsetOrValueRef == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51f,"(boundOffsetOrValueRef)","boundOffsetOrValueRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = ValueType::IsInt((ValueType *)&bounds_local->wasConstantUpperBoundEstablishedExplicitly);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x520,"(valueInfo->IsInt())","valueInfo->IsInt()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = ValueInfo::TryGetIntConstantValue
                    ((ValueInfo *)bounds_local,(int32 *)((long)&landingPadValue + 4),false);
  if (bVar3) {
    *boundOffsetOrValueRef = landingPadValue._4_4_;
    return VALUE;
  }
  if (landingPadGlobOptBlockData_local == (GlobOptBlockData *)0x0) {
    if ((valueInfo_local._7_1_ & 1) == 0) {
      bVar3 = ValueInfo::TryGetIntConstantUpperBound
                        ((ValueInfo *)bounds_local,boundOffsetOrValueRef,false);
    }
    else {
      bVar3 = ValueInfo::TryGetIntConstantLowerBound
                        ((ValueInfo *)bounds_local,boundOffsetOrValueRef,false);
    }
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x556,
                         "(landingPadValueIsLowerBound ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef) : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef))"
                         ,
                         "landingPadValueIsLowerBound ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef) : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef)"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    return VALUE;
  }
  pVStack_50 = GlobOptBlockData::FindValue(pGStack_40,&pSStack_20->super_Sym);
  if (pVStack_50 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x52f,"(landingPadValue)","landingPadValue");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pVVar6 = ::Value::GetValueInfo(pVStack_50);
  bVar3 = ValueType::IsInt(&pVVar6->super_ValueType);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x530,"(landingPadValue->GetValueInfo()->IsInt())",
                       "landingPadValue->GetValueInfo()->IsInt()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  boundSet = (RelativeIntBoundSet *)0x0;
  if ((valueInfo_local._7_1_ & 1) == 0) {
    local_80 = &IntBounds::RelativeUpperBounds((IntBounds *)landingPadGlobOptBlockData_local)->
                super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
  }
  else {
    local_80 = &IntBounds::RelativeLowerBounds((IntBounds *)landingPadGlobOptBlockData_local)->
                super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
  }
  pBStack_68 = local_80;
  pVVar6 = ::Value::GetValueInfo(pVStack_50);
  bVar3 = ValueInfo::TryGetIntConstantValue(pVVar6,(int32 *)((long)&bound + 4),false);
  pBVar2 = pBStack_68;
  if (!bVar3) {
    local_74 = ::Value::GetValueNumber(pVStack_50);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>(pBVar2,&local_74,(ValueRelativeOffset **)&boundSet);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      iVar4 = ValueRelativeOffset::Offset((ValueRelativeOffset *)boundSet);
      *boundOffsetOrValueRef = iVar4;
      return OFFSET;
    }
    return UNKNOWN;
  }
  if ((valueInfo_local._7_1_ & 1) == 0) {
    local_84 = IntBounds::ConstantUpperBound((IntBounds *)landingPadGlobOptBlockData_local);
  }
  else {
    local_84 = IntBounds::ConstantLowerBound((IntBounds *)landingPadGlobOptBlockData_local);
  }
  pBVar2 = pBStack_68;
  local_6c = local_84;
  if ((valueInfo_local._7_1_ & 1) == 0) {
    if (local_84 <= bound._4_4_) goto LAB_0061103e;
  }
  else if (bound._4_4_ <= local_84) goto LAB_0061103e;
  local_70 = ::Value::GetValueNumber(pVStack_50);
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>(pBVar2,&local_70,(ValueRelativeOffset **)&boundSet);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    return UNKNOWN;
  }
  local_6c = ValueRelativeOffset::Offset((ValueRelativeOffset *)boundSet);
  local_6c = bound._4_4_ + local_6c;
LAB_0061103e:
  *boundOffsetOrValueRef = local_6c;
  return VALUE;
}

Assistant:

GlobOpt::SymBoundType GlobOpt::DetermineSymBoundOffsetOrValueRelativeToLandingPad(
    StackSym *const sym,
    const bool landingPadValueIsLowerBound,
    ValueInfo *const valueInfo,
    const IntBounds *const bounds,
    GlobOptBlockData *const landingPadGlobOptBlockData,
    int *const boundOffsetOrValueRef)
{
    Assert(sym);
    Assert(!sym->IsTypeSpec());
    Assert(valueInfo);
    Assert(landingPadGlobOptBlockData);
    Assert(boundOffsetOrValueRef);
    Assert(valueInfo->IsInt());

    int constantValue;
    if(valueInfo->TryGetIntConstantValue(&constantValue))
    {
        // The sym's constant value is the constant bound value, so just return that. This is possible in loops such as
        // for(; i === 1; ++i){...}, where 'i' is an induction variable but has a constant value inside the loop, or in blocks
        // inside the loop such as if(i === 1){...}
        *boundOffsetOrValueRef = constantValue;
        return SymBoundType::VALUE;
    }

    if (bounds)
    {
        Value *const landingPadValue = landingPadGlobOptBlockData->FindValue(sym);
        Assert(landingPadValue);
        Assert(landingPadValue->GetValueInfo()->IsInt());

        int landingPadConstantValue;
        const ValueRelativeOffset* bound = nullptr;
        const RelativeIntBoundSet& boundSet = landingPadValueIsLowerBound ? bounds->RelativeLowerBounds() : bounds->RelativeUpperBounds();
        if (landingPadValue->GetValueInfo()->TryGetIntConstantValue(&landingPadConstantValue))
        {
            // The sym's bound already takes the landing pad constant value into consideration, unless the landing pad value was
            // updated to have a more aggressive range (and hence, now a constant value) as part of hoisting a bound check or some
            // other hoisting operation. The sym's bound also takes into consideration the change to the sym so far inside the loop,
            // and the landing pad constant value does not, so use the sym's bound by default.

            int constantBound = landingPadValueIsLowerBound ? bounds->ConstantLowerBound() : bounds->ConstantUpperBound();
            if(landingPadValueIsLowerBound ? landingPadConstantValue > constantBound : landingPadConstantValue < constantBound)
            {
                // The landing pad value became a constant value as part of a hoisting operation. The landing pad constant value is
                // a more aggressive bound, so use that instead, and take into consideration the change to the sym so far inside the
                // loop, using the relative bound to the landing pad value.
                if (!boundSet.TryGetReference(landingPadValue->GetValueNumber(), &bound))
                {
                    return SymBoundType::UNKNOWN;
                }
                constantBound = landingPadConstantValue + bound->Offset();
            }
            *boundOffsetOrValueRef = constantBound;
            return SymBoundType::VALUE;
        }

        if (!boundSet.TryGetReference(landingPadValue->GetValueNumber(), &bound))
        {
            return SymBoundType::UNKNOWN;
        }
        *boundOffsetOrValueRef = bound->Offset();
        return SymBoundType::OFFSET;
    }
    AssertVerify(
        landingPadValueIsLowerBound
        ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef)
        : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef));

    return SymBoundType::VALUE;
}